

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void gen_hermite_dr_compute(int order,double alpha,double *x,double *w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *weight;
  double *xtab;
  double dVar4;
  double *x_laguerre;
  double *w_laguerre;
  int order_laguerre;
  int i;
  double arg;
  double alpha_laguerre;
  double *w_local;
  double *x_local;
  double alpha_local;
  int order_local;
  
  if (order == 1) {
    *x = 0.0;
    dVar4 = tgamma((alpha + 1.0) / 2.0);
    *w = dVar4;
  }
  else {
    if (order % 2 == 0) {
      w_laguerre._0_4_ = order / 2;
      dVar4 = alpha - 1.0;
    }
    else {
      w_laguerre._0_4_ = (order + -1) / 2;
      dVar4 = alpha + 1.0;
    }
    arg = dVar4 / 2.0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)w_laguerre;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    weight = (double *)operator_new__(uVar3);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)w_laguerre;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    xtab = (double *)operator_new__(uVar3);
    gen_laguerre_ss_compute((int)w_laguerre,arg,xtab,weight);
    if (order % 2 == 0) {
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        dVar4 = sqrt(xtab[((int)w_laguerre + -1) - w_laguerre._4_4_]);
        x[w_laguerre._4_4_] = -dVar4;
      }
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        dVar4 = sqrt(xtab[w_laguerre._4_4_]);
        x[(int)w_laguerre + w_laguerre._4_4_] = dVar4;
      }
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        w[w_laguerre._4_4_] = weight[((int)w_laguerre + -1) - w_laguerre._4_4_] * 0.5;
      }
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        w[(int)w_laguerre + w_laguerre._4_4_] = weight[w_laguerre._4_4_] * 0.5;
      }
    }
    else if (order % 2 == 1) {
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        dVar4 = sqrt(xtab[((int)w_laguerre + -1) - w_laguerre._4_4_]);
        x[w_laguerre._4_4_] = -dVar4;
      }
      x[(int)w_laguerre] = 0.0;
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        dVar4 = sqrt(xtab[w_laguerre._4_4_]);
        x[(int)w_laguerre + 1 + w_laguerre._4_4_] = dVar4;
      }
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        w[w_laguerre._4_4_] =
             (weight[((int)w_laguerre + -1) - w_laguerre._4_4_] * 0.5) /
             xtab[((int)w_laguerre + -1) - w_laguerre._4_4_];
      }
      dVar4 = tgamma((alpha + 1.0) / 2.0);
      w[(int)w_laguerre] = dVar4;
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        w[(int)w_laguerre] = w[(int)w_laguerre] - weight[w_laguerre._4_4_] / xtab[w_laguerre._4_4_];
      }
      for (w_laguerre._4_4_ = 0; w_laguerre._4_4_ < (int)w_laguerre;
          w_laguerre._4_4_ = w_laguerre._4_4_ + 1) {
        w[(int)w_laguerre + 1 + w_laguerre._4_4_] =
             (weight[w_laguerre._4_4_] * 0.5) / xtab[w_laguerre._4_4_];
      }
    }
    if (weight != (double *)0x0) {
      operator_delete__(weight);
    }
    if (xtab != (double *)0x0) {
      operator_delete__(xtab);
    }
  }
  return;
}

Assistant:

void gen_hermite_dr_compute ( int order, double alpha, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_HERMITE_DR_COMPUTE computes a generalized Gauss-Hermite rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -oo < x < +oo ) |x|^ALPHA exp(-x^2) f(x) dx
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 March 2008
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//
//    Input, double ALPHA, the parameter.
//    -1.0 < ALPHA.
//
//    Output, double X[ORDER], the abscissas.
//
//    Output, double W[ORDER], the weights.
//
{
  double alpha_laguerre;
  double arg;
  int i;
  int order_laguerre;
  double *w_laguerre;
  double *x_laguerre;

  if ( order == 1 )
  {
    arg = ( alpha + 1.0 ) / 2.0;
    x[0] = 0.0;
    w[0] = tgamma ( arg );
    return;
  }

  if ( ( order % 2 ) == 0 ) 
  {
    order_laguerre = order / 2;
    alpha_laguerre = ( alpha - 1.0 ) / 2.0;
  }
  else
  {
    order_laguerre = ( order - 1 ) / 2;
    alpha_laguerre = ( alpha + 1.0 ) / 2.0;
  }
  
  w_laguerre = new double[order_laguerre];
  x_laguerre = new double[order_laguerre];

  gen_laguerre_ss_compute ( order_laguerre, alpha_laguerre, 
    x_laguerre, w_laguerre );

  if ( ( order % 2 ) == 0 )
  {
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[i] = - sqrt ( x_laguerre[order_laguerre-1-i] );
    }
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[order_laguerre+i] = sqrt ( x_laguerre[i] );
	}
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[i] = 0.5 * w_laguerre[order_laguerre-1-i];
    }
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre+i] = 0.5 * w_laguerre[i];
    }
  }
  else if ( ( order % 2 ) == 1 )
  {
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[i] = - sqrt ( x_laguerre[order_laguerre-1-i] );
    }
    x[order_laguerre] = 0.0;
    for ( i = 0; i < order_laguerre; i++ )
    {
      x[order_laguerre+1+i] = sqrt ( x_laguerre[i] );
	}
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[i] = 0.5 * w_laguerre[order_laguerre-1-i] / x_laguerre[order_laguerre-1-i];
    }

    arg = ( alpha + 1.0 ) / 2.0;
    w[order_laguerre] = tgamma ( arg );
    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre] = w[order_laguerre] - w_laguerre[i] / x_laguerre[i];
    }

    for ( i = 0; i < order_laguerre; i++ )
    {
      w[order_laguerre+1+i] = 0.5 * w_laguerre[i] / x_laguerre[i];
    }
  }
  delete [] w_laguerre;
  delete [] x_laguerre;

  return;
}